

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall
CDirectiveFile::initCopy(CDirectiveFile *this,path *inputName,path *outputName,int64_t memory)

{
  FileManager *this_00;
  shared_ptr<AssemblerFile> local_98;
  path local_88;
  undefined1 local_68 [8];
  path fullOutputName;
  path fullInputName;
  int64_t memory_local;
  path *outputName_local;
  path *inputName_local;
  CDirectiveFile *this_local;
  
  *(undefined4 *)&(this->super_CAssemblerCommand).field_0x14 = 3;
  getFullPathName((path *)((long)&fullOutputName._path.field_2 + 8),inputName);
  getFullPathName((path *)local_68,outputName);
  std::make_shared<GenericAssemblerFile,ghc::filesystem::path&,ghc::filesystem::path&,long&>
            (&local_88,(path *)local_68,(long *)(fullOutputName._path.field_2._M_local_buf + 8));
  std::shared_ptr<GenericAssemblerFile>::operator=
            (&this->file,(shared_ptr<GenericAssemblerFile> *)&local_88);
  std::shared_ptr<GenericAssemblerFile>::~shared_ptr((shared_ptr<GenericAssemblerFile> *)&local_88);
  this_00 = g_fileManager;
  std::shared_ptr<AssemblerFile>::shared_ptr<GenericAssemblerFile,void>(&local_98,&this->file);
  FileManager::addFile(this_00,&local_98);
  std::shared_ptr<AssemblerFile>::~shared_ptr(&local_98);
  Global.Section = Global.Section + 1;
  CAssemblerCommand::updateSection(&this->super_CAssemblerCommand,Global.Section);
  ghc::filesystem::path::~path((path *)local_68);
  ghc::filesystem::path::~path((path *)((long)&fullOutputName._path.field_2 + 8));
  return;
}

Assistant:

void CDirectiveFile::initCopy(const fs::path& inputName, const fs::path& outputName, int64_t memory)
{
	type = Type::Copy;
	fs::path fullInputName = getFullPathName(inputName);
	fs::path fullOutputName = getFullPathName(outputName);
	
	file = std::make_shared<GenericAssemblerFile>(fullOutputName,fullInputName,memory);
	g_fileManager->addFile(file);

	updateSection(++Global.Section);
}